

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O3

void __thiscall wasm::PoppifyPass::~PoppifyPass(PoppifyPass *this)

{
  Pass::~Pass(&this->super_Pass);
  operator_delete(this,0x58);
  return;
}

Assistant:

void run(Module* module) {
    PassRunner subRunner(getPassRunner());
    subRunner.add(std::make_unique<PoppifyFunctionsPass>());
    // TODO: Enable this once it handles Poppy blocks correctly
    // subRunner.add(std::make_unique<ReFinalize>());
    subRunner.run();
    lowerTupleGlobals(module);
  }